

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddVarIsInCube(DdNode *bCube,int iVar)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  bool local_31;
  DdNode *bCube1;
  DdNode *bCube0;
  DdNode *pDStack_18;
  int iVar_local;
  DdNode *bCube_local;
  
  pDStack_18 = bCube;
  while( true ) {
    if (*(int *)((ulong)pDStack_18 & 0xfffffffffffffffe) == 0x7fffffff) {
      return -1;
    }
    pDVar1 = (DdNode *)
             (*(ulong *)(((ulong)pDStack_18 & 0xfffffffffffffffe) + 0x18) ^
             (long)(int)((uint)pDStack_18 & 1));
    pDVar2 = (DdNode *)
             (*(ulong *)(((ulong)pDStack_18 & 0xfffffffffffffffe) + 0x10) ^
             (long)(int)((uint)pDStack_18 & 1));
    if (((((ulong)pDVar1 & 1) == 0) || (*(int *)((ulong)pDVar1 & 0xfffffffffffffffe) != 0x7fffffff))
       && ((((ulong)pDVar2 & 1) == 0 || (*(int *)((ulong)pDVar2 & 0xfffffffffffffffe) != 0x7fffffff)
           ))) break;
    if (*(int *)((ulong)pDStack_18 & 0xfffffffffffffffe) == iVar) {
      local_31 = false;
      if (((ulong)pDVar1 & 1) != 0) {
        local_31 = *(int *)((ulong)pDVar1 & 0xfffffffffffffffe) == 0x7fffffff;
      }
      return (uint)local_31;
    }
    pDStack_18 = pDVar1;
    if ((((ulong)pDVar1 & 1) != 0) && (*(int *)((ulong)pDVar1 & 0xfffffffffffffffe) == 0x7fffffff))
    {
      pDStack_18 = pDVar2;
    }
  }
  __assert_fail("(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                ,0x429,"int Extra_bddVarIsInCube(DdNode *, int)");
}

Assistant:

int Extra_bddVarIsInCube( DdNode * bCube, int iVar )
{
    DdNode * bCube0, * bCube1;
    while ( Cudd_Regular(bCube)->index != CUDD_CONST_INDEX )
    {
        bCube0 = Cudd_NotCond( cuddE(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        bCube1 = Cudd_NotCond( cuddT(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        // make sure it is a cube
        assert( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || // bCube0 == 0
                (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX) ); // bCube1 == 0
        // quit if it is the last one
        if ( Cudd_Regular(bCube)->index == iVar )
            return (int)(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX);
        // get the next cube
        if ( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) )
            bCube = bCube1;
        else
            bCube = bCube0;
    }
    return -1;
}